

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void __thiscall
soul::HTMLGenerator::printSpecialisationParams(HTMLGenerator *this,HTMLElement *parent,Module *m)

{
  Module *parent_00;
  bool bVar1;
  bool bVar2;
  HTMLElement *pHVar3;
  long lVar4;
  long lVar5;
  pointer *this_00;
  size_type sVar6;
  const_reference pvVar7;
  ulong uVar8;
  string_view sVar9;
  string_view local_1c8 [2];
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string_view local_148;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  HTMLElement *local_108;
  HTMLElement *name;
  string_view local_f0;
  reference local_e0;
  SpecialisationParameter *p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>
  *__range3;
  size_type indent;
  undefined1 auStack_b0 [7];
  bool isFirst;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  HTMLElement *local_40;
  HTMLElement *desc;
  HTMLElement *local_28;
  HTMLElement *section;
  Module *m_local;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  
  section = (HTMLElement *)m;
  m_local = (Module *)parent;
  parent_local = (HTMLElement *)this;
  bVar1 = std::
          vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>
          ::empty(&m->specialisationParams);
  parent_00 = m_local;
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&desc,"Specialisation Parameters"
              );
    local_28 = createModuleSection(this,(HTMLElement *)parent_00,_desc);
    pHVar3 = choc::html::HTMLElement::addParagraph(local_28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"code_block")
    ;
    pHVar3 = choc::html::HTMLElement::setClass(pHVar3,local_50);
    local_40 = pHVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"module_type");
    pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_60);
    local_70 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&section->properties);
    choc::html::HTMLElement::addContent(pHVar3,local_70);
    pHVar3 = local_40;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80," ");
    choc::html::HTMLElement::addContent(pHVar3,local_80);
    pHVar3 = local_40;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_90,"module_name");
    pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_90);
    local_a0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)
                          &(section->children).
                           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
    choc::html::HTMLElement::addContent(pHVar3,local_a0);
    pHVar3 = local_40;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b0," (");
    choc::html::HTMLElement::addContent(pHVar3,_auStack_b0);
    bVar1 = true;
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::length();
    this_00 = &section[2].properties.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    __end3 = std::
             vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>
             ::begin((vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>
                      *)this_00);
    p = (SpecialisationParameter *)
        std::
        vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>
        ::end((vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>
               *)this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_soul::SourceCodeModel::SpecialisationParameter_*,_std::vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>_>
                                  *)&p);
      pHVar3 = local_40;
      if (!bVar2) break;
      local_e0 = __gnu_cxx::
                 __normal_iterator<const_soul::SourceCodeModel::SpecialisationParameter_*,_std::vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>_>
                 ::operator*(&__end3);
      pHVar3 = local_40;
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,",");
        pHVar3 = choc::html::HTMLElement::addContent(pHVar3,local_f0);
        pHVar3 = choc::html::HTMLElement::addLineBreak(pHVar3);
        choc::html::HTMLElement::addNBSP(pHVar3,lVar4 + lVar5 + 3);
      }
      pHVar3 = printExpression(this,local_40,&local_e0->type);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&name," ");
      choc::html::HTMLElement::addContent(pHVar3,_name);
      pHVar3 = local_40;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_118,"variable_name");
      pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_118);
      local_108 = pHVar3;
      sVar9 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e0->name);
      local_128 = sVar9;
      choc::html::HTMLElement::addContent(pHVar3,sVar9);
      sVar6 = std::
              vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ::size((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                      *)local_e0);
      if (sVar6 == 1) {
        pvVar7 = std::
                 vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 ::front((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                          *)local_e0);
        bVar2 = std::operator==(&pvVar7->text,"using");
        if (bVar2) {
          uVar8 = std::__cxx11::string::empty();
          pHVar3 = local_108;
          if ((uVar8 & 1) == 0) {
            sVar9 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&local_e0->UID);
            local_138 = sVar9;
            choc::html::HTMLElement::setID(pHVar3,sVar9);
          }
        }
      }
      uVar8 = std::__cxx11::string::empty();
      pHVar3 = local_40;
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_1a8,(string *)&local_e0->defaultValue);
        choc::text::trim(&local_188,&local_1a8);
        std::operator+(&local_168," = ",&local_188);
        sVar9 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_168);
        local_148 = sVar9;
        choc::html::HTMLElement::addContent(pHVar3,sVar9);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      __gnu_cxx::
      __normal_iterator<const_soul::SourceCodeModel::SpecialisationParameter_*,_std::vector<soul::SourceCodeModel::SpecialisationParameter,_std::allocator<soul::SourceCodeModel::SpecialisationParameter>_>_>
      ::operator++(&__end3);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_1c8,")");
    choc::html::HTMLElement::addContent(pHVar3,local_1c8[0]);
  }
  return;
}

Assistant:

void printSpecialisationParams (choc::html::HTMLElement& parent, const SourceCodeModel::Module& m)
    {
        if (! m.specialisationParams.empty())
        {
            auto& section = createModuleSection (parent, "Specialisation Parameters");

            auto& desc = section.addParagraph().setClass ("code_block");

            desc.addSpan ("module_type").addContent (m.moduleTypeDescription);
            desc.addContent (" ");
            desc.addSpan ("module_name").addContent (m.fullyQualifiedName);
            desc.addContent (" (");

            bool isFirst = true;
            auto indent = m.moduleTypeDescription.length() + m.fullyQualifiedName.length() + 3;

            for (auto& p : m.specialisationParams)
            {
                if (isFirst)
                    isFirst = false;
                else
                    desc.addContent (",").addLineBreak().addNBSP (indent);

                printExpression (desc, p.type).addContent (" ");

                auto& name = desc.addSpan ("variable_name");
                name.addContent (p.name);

                if (p.type.sections.size() == 1 && p.type.sections.front().text == "using")
                {
                    if (! p.UID.empty())
                        name.setID (p.UID);
                }

                if (! p.defaultValue.empty())
                    desc.addContent (" = " + choc::text::trim (p.defaultValue));
            }

            desc.addContent (")");
        }
    }